

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

bool check_parry(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  ushort uVar1;
  bool bVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  OBJ_DATA *pOVar9;
  CClass *pCVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  float local_243c;
  char buf2 [4608];
  char buf1 [4608];
  
  bVar2 = is_awake(victim);
  if (!bVar2) {
    return false;
  }
  iVar5 = get_skill(victim,(int)gsn_parry);
  local_243c = (float)(iVar5 / 2);
  pOVar9 = get_eq_char(victim,0x10);
  if (pOVar9 == (OBJ_DATA *)0x0) {
    bVar2 = is_npc(victim);
    if (bVar2) {
      local_243c = local_243c * 0.5;
    }
    else {
      bVar2 = is_affected(victim,(int)gsn_hardenfist);
      if (!bVar2) {
        return false;
      }
    }
  }
  bVar2 = is_affected_by(victim,0x15);
  if (bVar2) {
    local_243c = local_243c + 20.0;
  }
  bVar2 = is_affected_by(ch,0x15);
  if (bVar2) {
    local_243c = local_243c + -15.0;
  }
  iVar5 = get_skill(victim,(int)gsn_champions_defense);
  if (1 < iVar5) {
    iVar6 = number_percent();
    if ((double)iVar6 < (double)iVar5 * 0.85) {
      local_243c = local_243c + 10.0;
    }
    check_improve(victim,(int)gsn_champions_defense,(double)iVar6 < (double)iVar5 * 0.85,1);
  }
  local_243c = (float)(int)ch->defense_mod + local_243c;
  bVar2 = is_npc(ch);
  if (!bVar2) {
    uVar1 = ch->pcdata->energy_state;
    uVar3 = -uVar1;
    if (0 < (short)uVar1) {
      uVar3 = uVar1;
    }
    if (1 < uVar3) {
      dVar16 = pow(3.0,(double)uVar3);
      local_243c = (float)((double)local_243c - dVar16);
    }
  }
  uVar7 = (int)ch->size - (int)victim->size;
  uVar8 = -uVar7;
  if (0 < (int)uVar7) {
    uVar8 = uVar7;
  }
  local_243c = local_243c - (float)((uVar8 & 0xffff) * 5);
  pOVar9 = get_eq_char(ch,(uint)(gsn_dual_wield == dt) * 2 + 0x10);
  if (pOVar9 != (OBJ_DATA *)0x0) {
    switch(pOVar9->value[0]) {
    case 0:
      break;
    case 1:
      local_243c = local_243c + 5.0;
      break;
    case 2:
    case 8:
      local_243c = local_243c + -5.0;
      break;
    case 3:
    case 9:
      local_243c = local_243c + 0.0;
      break;
    case 4:
    case 5:
      local_243c = local_243c + -10.0;
      break;
    case 6:
    case 7:
      local_243c = local_243c + 10.0;
      break;
    default:
      local_243c = local_243c + 40.0;
    }
  }
  pOVar9 = get_eq_char(victim,0x10);
  if (pOVar9 != (OBJ_DATA *)0x0) {
    switch(pOVar9->value[0]) {
    case 0:
      break;
    case 1:
      local_243c = local_243c + 10.0;
      break;
    default:
      local_243c = local_243c + -20.0;
      break;
    case 3:
    case 8:
    case 9:
      local_243c = local_243c + 15.0;
      break;
    case 4:
    case 5:
    case 6:
      local_243c = local_243c + -10.0;
    }
  }
  bVar2 = is_npc(ch);
  if (((!bVar2) && (iVar5 = check_posture(ch), iVar5 == -1)) &&
     (bVar2 = style_check((int)gsn_posture,(int)ch->pcdata->style), bVar2)) {
    local_243c = local_243c + 20.0;
  }
  bVar2 = is_npc(victim);
  if (!bVar2) {
    iVar5 = check_posture(victim);
    if ((iVar5 == -1) && (bVar2 = style_check((int)gsn_posture,(int)victim->pcdata->style), bVar2))
    {
      local_243c = local_243c + 20.0;
    }
    iVar5 = check_posture(victim);
    if ((iVar5 == 1) && (bVar2 = style_check((int)gsn_posture,(int)victim->pcdata->style), bVar2)) {
      local_243c = local_243c + -20.0;
    }
  }
  bVar2 = is_evil(victim);
  if (((bVar2) && (victim->level < ch->level)) && (bVar2 = is_affected(ch,(int)gsn_awe), bVar2)) {
    local_243c = local_243c + -10.0;
  }
  local_243c = (((float)(int)ch->balance + (local_243c - (float)(int)victim->balance)) -
               (float)(int)ch->batter) - (float)ch->analyze;
  if (victim->analyzePC == ch) {
    local_243c = local_243c + (float)victim->analyze;
  }
  bVar2 = is_npc(victim);
  if ((!bVar2) && ((victim->act[0] & 0x200000) != 0)) {
    local_243c = local_243c * 0.5;
  }
  bVar2 = check_entwine(victim,1);
  if (bVar2) {
    local_243c = local_243c * 0.5;
  }
  uVar8 = get_attack_number(ch,dt);
  iVar5 = attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8].modifier;
  sVar4 = get_hitroll(ch);
  fVar15 = ((float)(int)sVar4 / -250.0 + 1.0) * ((float)iVar5 + local_243c);
  bVar2 = is_npc(victim);
  if (!bVar2) {
    pCVar10 = char_data::Class(victim);
    iVar5 = CClass::GetIndex(pCVar10);
    if (iVar5 == 10) {
      fVar15 = fVar15 * 0.7;
      goto LAB_002eb0b8;
    }
  }
  bVar2 = is_npc(victim);
  if (!bVar2) {
    pCVar10 = char_data::Class(victim);
    iVar5 = CClass::GetIndex(pCVar10);
    if (iVar5 == 0xb) {
      fVar15 = fVar15 * 0.85;
    }
  }
LAB_002eb0b8:
  fVar17 = 95.0;
  if (fVar15 <= 95.0) {
    fVar17 = fVar15;
  }
  iVar5 = number_percent();
  if (fVar17 <= (float)iVar5) {
    return false;
  }
  iVar5 = (int)(fVar17 - (float)iVar5);
  pcVar11 = get_attack_noun(ch,dt);
  pcVar12 = "";
  if (0x32 < iVar5) {
    pcVar12 = "confidently ";
  }
  pcVar14 = "confidently parries";
  if (iVar5 < 0x32) {
    pcVar14 = "parries";
  }
  pcVar13 = "manage to ";
  if (0xe < iVar5) {
    pcVar13 = pcVar12;
  }
  pcVar12 = "manages to parry";
  if (0xe < iVar5) {
    pcVar12 = pcVar14;
  }
  sprintf(buf1,"You %sparry $n\'s %s.",pcVar13,pcVar11);
  sprintf(buf2,"$N %s your %s.",pcVar12,pcVar11);
  if ((victim->wiznet[0] & 0x200000) != 0) {
    sprintf(buf1,"You parry $n\'s %s. (%d%%)",pcVar11,(ulong)(uint)(int)fVar17);
  }
  if ((ch->wiznet[0] & 0x200000) != 0) {
    sprintf(buf2,"$N parries your %s. (%d%%)",pcVar11,(ulong)(uint)(int)fVar17);
  }
  act(buf1,ch,(void *)0x0,victim,2);
  act(buf2,ch,(void *)0x0,victim,3);
  check_improve(victim,(int)gsn_parry,true,2);
  bVar2 = is_npc(ch);
  if (bVar2) {
    if ((ch->progtypes[0] & 0x10) == 0) {
      return true;
    }
    bVar2 = str_cmp(ch->pIndexData->mprogs->fight_name,"fight_prog_barbarian");
    if (bVar2) {
      return true;
    }
  }
  else {
    bVar2 = style_check((int)gsn_batter,(int)ch->pcdata->style);
    if (!bVar2) {
      return true;
    }
  }
  check_batter(ch);
  return true;
}

Assistant:

bool check_parry(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	int cd_sk = 0;
	float chance = 0;
	OBJ_DATA *wield;
	char buf1[MAX_STRING_LENGTH], buf2[MAX_STRING_LENGTH];
	char *attack;
	OBJ_DATA *victimwield;
	int roll, diff;

	if (!is_awake(victim))
		return false;

	chance = get_skill(victim, gsn_parry) / 2;

	if (get_eq_char(victim, WEAR_WIELD) == nullptr)
	{
		if (is_npc(victim))
		{
			chance /= 2;
		}
		else if (!is_affected(victim, gsn_hardenfist))
			return false;
	}

	if (is_affected_by(victim, AFF_HASTE))
		chance += 20;

	if (is_affected_by(ch, AFF_HASTE))
		chance -= 15;

	cd_sk = get_skill(victim, gsn_champions_defense);

	if (cd_sk > 1)
	{
		if (number_percent() < (cd_sk * .85))
		{
			chance += 10;
			check_improve(victim, gsn_champions_defense, true, 1);
		}
		else
		{
			check_improve(victim, gsn_champions_defense, false, 1);
		}
	}

	chance += ch->defense_mod;

	if (!is_npc(ch) && abs(ch->pcdata->energy_state) > 1)
		chance -= pow(3, abs(ch->pcdata->energy_state));

	chance -= 5 * abs((ch->size - victim->size));

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);
	else
		wield = get_eq_char(ch, WEAR_WIELD);

	if (wield != nullptr)
	{
		switch (wield->value[0])
		{
			case WEAPON_SWORD:
				chance += 5;
				break;
			case WEAPON_DAGGER:
				chance -= 5;
				break;
			case WEAPON_SPEAR:
				chance += 0;
				break;
			case WEAPON_STAFF:
				chance += 0;
				break;
			case WEAPON_MACE:
				chance -= 10;
				break;
			case WEAPON_AXE:
				chance -= 10;
				break;
			case WEAPON_FLAIL:
				chance += 10;
				break;
			case WEAPON_WHIP:
				chance += 10;
				break;
			case WEAPON_POLEARM:
				chance -= 5;
				break;
			case WEAPON_EXOTIC:
				break;
			default:
				chance += 40;
				break;
		}
	}

	victimwield = get_eq_char(victim, WEAR_WIELD);

	if (victimwield != nullptr)
	{
		switch (victimwield->value[0])
		{
			case WEAPON_SWORD:
				chance += 10;
				break;
			case WEAPON_DAGGER:
				chance -= 20;
				break;
			case WEAPON_SPEAR:
				chance += 15;
				break;
			case WEAPON_STAFF:
				chance += 15;
				break;
			case WEAPON_MACE:
				chance -= 10;
				break;
			case WEAPON_AXE:
				chance -= 10;
				break;
			case WEAPON_FLAIL:
				chance -= 10;
				break;
			case WEAPON_WHIP:
				chance -= 20;
				break;
			case WEAPON_POLEARM:
				chance += 15;
				break;
			case WEAPON_EXOTIC:
				break;
			default:
				chance -= 20;
				break;
		}
	}

	/* posture */
	if (!is_npc(ch))
	{
		if (check_posture(ch) == POSTURE_DEFENSE && style_check(gsn_posture, ch->pcdata->style))
			chance += 20;
	}

	if (!is_npc(victim))
	{
		if (check_posture(victim) == POSTURE_DEFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance += 20;
		if (check_posture(victim) == POSTURE_OFFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance -= 20;
	}

	if (is_evil(victim) && (ch->level > victim->level) && is_affected(ch, gsn_awe))
		chance -= 10;

	chance -= victim->balance;
	chance += ch->balance;
	chance -= ch->batter;
	chance -= ch->analyze;

	if (victim->analyzePC == ch)
		chance += victim->analyze;

	if (!is_npc(victim) && IS_SET(victim->act, PLR_MORON))
		chance /= 2;

	if (check_entwine(victim, 1))
		chance /= 2;

	chance += attack_table[get_attack_number(ch, dt)].modifier;
	chance *= (1 - ((float)get_hitroll(ch) / (float)250));

	if (!is_npc(victim) && victim->Class()->GetIndex() == CLASS_NECROMANCER)
		chance *= .7;
	else if (!is_npc(victim) && victim->Class()->GetIndex() == CLASS_SORCERER)
		chance *= .85;

	chance = std::min(chance, (float)95);

	roll = number_percent();

	if (roll >= chance)
		return false;

	diff = (int)(chance - (float)roll);

	attack = get_dam_message(ch, dt);
	sprintf(buf1, "You %sparry $n's %s.", (diff < 15) ? "manage to " : (diff > 50) ? "confidently " : "", attack);
	sprintf(buf2, "$N %s your %s.", (diff < 15) ? "manages to parry" : (diff < 50) ? "parries" : "confidently parries", attack);

	if (IS_SET(victim->wiznet, WIZ_PERCENT))
		sprintf(buf1, "You parry $n's %s. (%d%%)", attack, (int)chance);

	if (IS_SET(ch->wiznet, WIZ_PERCENT))
		sprintf(buf2, "$N parries your %s. (%d%%)", attack, (int)chance);

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);
	check_improve(victim, gsn_parry, true, 2);

	/* Barbarian batter check */

	if (!is_npc(ch))
	{
		if (style_check(gsn_batter, ch->pcdata->style))
			check_batter(ch);
	}
	else if (IS_SET(ch->progtypes, MPROG_FIGHT) && !str_cmp(ch->pIndexData->mprogs->fight_name, "fight_prog_barbarian"))
	{
		check_batter(ch);
	}

	return true;
}